

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  double *pdVar1;
  double *pdVar2;
  long end;
  long start;
  double dVar3;
  long lVar4;
  Index index;
  long lVar5;
  
  end = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
        m_storage.m_rows;
  lVar4 = end / 2;
  start = lVar4 * 2;
  for (lVar5 = 0; SBORROW8(lVar5,start) != lVar5 + lVar4 * -2 < 0; lVar5 = lVar5 + 2) {
    pdVar1 = (kernel->m_src->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>).m_d.
             data + lVar5;
    dVar3 = pdVar1[1];
    pdVar2 = (kernel->m_dst->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>).m_d.
             data + lVar5;
    *pdVar2 = *pdVar1;
    pdVar2[1] = dVar3;
  }
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::evaluator<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::assign_op<double,double>,0>>
            (kernel,start,end);
  return;
}

Assistant:

Index rows() const EIGEN_NOEXCEPT { return m_dstExpr.rows(); }